

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O2

_Bool trans_VCVT(DisasContext_conflict1 *s,arg_VCVT *a)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int reg;
  int reg_00;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var5;
  int val;
  TCGv_ptr arg2;
  TCGv_i32 arg2_00;
  TCGv_i32 retval;
  TCGv_i64 var;
  TCGv_i64 arg;
  TCGv_i32 pTVar6;
  TCGv_i32 retval_00;
  code *func;
  uintptr_t o_2;
  uintptr_t o_1;
  uintptr_t o_4;
  uintptr_t o;
  TCGTemp *local_48;
  TCGv_i32 local_40;
  TCGv_ptr local_38;
  
  if ((s->isar->mvfr2 & 0xe0) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    iVar2 = a->dp;
    iVar3 = a->op;
    bVar1 = "\x04"[a->rm];
    if ((iVar2 == 0) ||
       ((uVar4 = s->isar->mvfr0, (uVar4 & 0xf00) != 0 &&
        (((uVar4 & 0xe) != 0 || ((a->vm & 0x10) == 0)))))) {
      reg = a->vd;
      reg_00 = a->vm;
      _Var5 = vfp_access_check(s);
      if (!_Var5) {
        return true;
      }
      arg2 = get_fpstatus_ptr_aarch64(tcg_ctx,0);
      arg2_00 = tcg_const_i32_aarch64(tcg_ctx,0);
      val = arm_rmode_to_sf_aarch64((uint)bVar1);
      retval = tcg_const_i32_aarch64(tcg_ctx,val);
      gen_helper_set_rmode(tcg_ctx,retval,retval,arg2);
      if (iVar2 == 0) {
        pTVar6 = tcg_temp_new_i32(tcg_ctx);
        retval_00 = tcg_temp_new_i32(tcg_ctx);
        neon_load_reg32(tcg_ctx,pTVar6,reg_00);
        if (iVar3 == 0) {
          gen_helper_vfp_touls(tcg_ctx,retval_00,pTVar6,arg2_00,arg2);
        }
        else {
          gen_helper_vfp_tosls(tcg_ctx,retval_00,pTVar6,arg2_00,arg2);
        }
        neon_store_reg32(tcg_ctx,retval_00,reg);
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(retval_00 + (long)tcg_ctx));
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
      }
      else {
        var = tcg_temp_new_i64(tcg_ctx);
        arg = tcg_temp_new_i64(tcg_ctx);
        pTVar6 = tcg_temp_new_i32(tcg_ctx);
        neon_load_reg64(tcg_ctx,var,reg_00);
        local_40 = arg2_00 + (long)&tcg_ctx->pool_cur;
        local_38 = arg2 + (long)&tcg_ctx->pool_cur;
        if (iVar3 == 0) {
          func = helper_vfp_tould_aarch64;
        }
        else {
          func = helper_vfp_tosld_aarch64;
        }
        local_48 = (TCGTemp *)(var + (long)tcg_ctx);
        tcg_gen_callN_aarch64(tcg_ctx,func,(TCGTemp *)(arg + (long)&tcg_ctx->pool_cur),3,&local_48);
        tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,pTVar6,arg);
        neon_store_reg32(tcg_ctx,pTVar6,reg);
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg + (long)&tcg_ctx->pool_cur));
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var + (long)tcg_ctx));
      }
      gen_helper_set_rmode(tcg_ctx,retval,retval,arg2);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(retval + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg2_00 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
      return true;
    }
  }
  return false;
}

Assistant:

static bool trans_VCVT(DisasContext *s, arg_VCVT *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t rd, rm;
    bool dp = a->dp;
    TCGv_ptr fpst;
    TCGv_i32 tcg_rmode, tcg_shift;
    int rounding = fp_decode_rm[a->rm];
    bool is_signed = a->op;

    if (!dc_isar_feature(aa32_vcvt_dr, s)) {
        return false;
    }

    if (dp && !dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (dp && !dc_isar_feature(aa32_simd_r32, s) && (a->vm & 0x10)) {
        return false;
    }

    rd = a->vd;
    rm = a->vm;

    if (!vfp_access_check(s)) {
        return true;
    }

    fpst = get_fpstatus_ptr(tcg_ctx, 0);

    tcg_shift = tcg_const_i32(tcg_ctx, 0);

    tcg_rmode = tcg_const_i32(tcg_ctx, arm_rmode_to_sf(rounding));
    gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, fpst);

    if (dp) {
        TCGv_i64 tcg_double, tcg_res;
        TCGv_i32 tcg_tmp;
        tcg_double = tcg_temp_new_i64(tcg_ctx);
        tcg_res = tcg_temp_new_i64(tcg_ctx);
        tcg_tmp = tcg_temp_new_i32(tcg_ctx);
        neon_load_reg64(tcg_ctx, tcg_double, rm);
        if (is_signed) {
            gen_helper_vfp_tosld(tcg_ctx, tcg_res, tcg_double, tcg_shift, fpst);
        } else {
            gen_helper_vfp_tould(tcg_ctx, tcg_res, tcg_double, tcg_shift, fpst);
        }
        tcg_gen_extrl_i64_i32(tcg_ctx, tcg_tmp, tcg_res);
        neon_store_reg32(tcg_ctx, tcg_tmp, rd);
        tcg_temp_free_i32(tcg_ctx, tcg_tmp);
        tcg_temp_free_i64(tcg_ctx, tcg_res);
        tcg_temp_free_i64(tcg_ctx, tcg_double);
    } else {
        TCGv_i32 tcg_single, tcg_res;
        tcg_single = tcg_temp_new_i32(tcg_ctx);
        tcg_res = tcg_temp_new_i32(tcg_ctx);
        neon_load_reg32(tcg_ctx, tcg_single, rm);
        if (is_signed) {
            gen_helper_vfp_tosls(tcg_ctx, tcg_res, tcg_single, tcg_shift, fpst);
        } else {
            gen_helper_vfp_touls(tcg_ctx, tcg_res, tcg_single, tcg_shift, fpst);
        }
        neon_store_reg32(tcg_ctx, tcg_res, rd);
        tcg_temp_free_i32(tcg_ctx, tcg_res);
        tcg_temp_free_i32(tcg_ctx, tcg_single);
    }

    gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, fpst);
    tcg_temp_free_i32(tcg_ctx, tcg_rmode);

    tcg_temp_free_i32(tcg_ctx, tcg_shift);

    tcg_temp_free_ptr(tcg_ctx, fpst);

    return true;
}